

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O1

bool HPack::anon_unknown_0::read_bit_pattern(BitPattern pattern,BitIStream *inputStream)

{
  byte bVar1;
  bool bVar2;
  quint64 qVar3;
  long in_FS_OFFSET;
  uchar chunk;
  byte local_21;
  long local_20;
  
  bVar1 = pattern.bitLength;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = 0;
  qVar3 = BitIStream::peekBits<unsigned_char>
                    (inputStream,inputStream->offset,(ulong)bVar1,&local_21);
  if (((uint)qVar3 == (uint)bVar1) &&
     (local_21 = local_21 >> (8U - (char)qVar3 & 0x1f), (ushort)local_21 == ((ushort)pattern & 0xff)
     )) {
    BitIStream::skipBits(inputStream,(ulong)bVar1);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool read_bit_pattern(BitPattern pattern, BitIStream &inputStream)
{
    uchar chunk = 0;

    const quint32 bitsRead = inputStream.peekBits(inputStream.streamOffset(),
                                                  pattern.bitLength, &chunk);
    if (bitsRead != pattern.bitLength)
        return false;

    // Since peekBits packs in the most significant bits, shift it!
    chunk >>= (8 - bitsRead);
    if (chunk != pattern.value)
        return false;

    inputStream.skipBits(pattern.bitLength);

    return true;
}